

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8_range.cc
# Opt level: O3

void re2c::UTF8splitByRuneLength(RangeSuffix **root,rune l,rune h)

{
  uint32_t n;
  uint32_t i;
  rune h_00;
  
  n = utf8::rune_length(h);
  i = utf8::rune_length(l);
  if (i < n) {
    do {
      h_00 = utf8::max_rune(i);
      UTF8splitByContinuity(root,l,h_00,i);
      l = h_00 + 1;
      i = i + 1;
    } while (n != i);
  }
  UTF8splitByContinuity(root,l,h,n);
  return;
}

Assistant:

void UTF8splitByRuneLength(RangeSuffix * & root, utf8::rune l, utf8::rune h)
{
	const uint32_t nh = utf8::rune_length(h);
	for (uint32_t nl = utf8::rune_length(l); nl < nh; ++nl)
	{
		utf8::rune r = utf8::max_rune(nl);
		UTF8splitByContinuity(root, l, r, nl);
		l = r + 1;
	}
	UTF8splitByContinuity(root, l, h, nh);
}